

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* get_reference_map(string *reference)

{
  char *__s;
  undefined8 uVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  long lVar3;
  long local_328;
  ifstream ref_handle;
  byte abStack_308 [488];
  long *local_120 [2];
  long local_110 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  undefined1 local_c0 [8];
  string current_chr;
  long local_90 [2];
  undefined1 local_80 [8];
  string tmp_str;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string buff_string;
  
  tmp_str.field_2._8_8_ = operator_new(0x30);
  *(undefined8 *)(tmp_str.field_2._8_8_ + 0x10) = 0;
  *(undefined8 *)(tmp_str.field_2._8_8_ + 0x18) = 0;
  *(undefined8 *)(tmp_str.field_2._8_8_ + 0x20) = 0;
  *(undefined8 *)(tmp_str.field_2._8_8_ + 0x28) = 0;
  *(undefined8 *)tmp_str.field_2._8_8_ = 0;
  *(undefined8 *)(tmp_str.field_2._8_8_ + 8) = 0;
  *(undefined8 **)(tmp_str.field_2._8_8_ + 0x18) = (undefined8 *)(tmp_str.field_2._8_8_ + 8);
  *(undefined8 **)(tmp_str.field_2._8_8_ + 0x20) = (undefined8 *)(tmp_str.field_2._8_8_ + 8);
  *(undefined8 *)(tmp_str.field_2._8_8_ + 0x28) = 0;
  std::ifstream::ifstream(&local_328,(string *)reference,_S_in);
  local_80 = (undefined1  [8])&tmp_str._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"");
  __s = (char *)calloc(0x400,1);
  local_c0 = (undefined1  [8])&current_chr._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"");
  uVar1 = std::__basic_file<char>::is_open();
  if ((char)uVar1 != '\0') {
    buff_string.field_2._12_4_ = (undefined4)CONCAT71((int7)((ulong)uVar1 >> 8),1);
    while( true ) {
      std::ios::widen((char)*(undefined8 *)(local_328 + -0x18) + (char)&local_328);
      std::istream::getline((char *)&local_328,(long)__s,'\0');
      if ((abStack_308[*(long *)(local_328 + -0x18)] & 2) != 0) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,__s,(allocator<char> *)&local_100);
      local_100.first._M_dataplus._M_p._0_1_ = 10;
      _Var2 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (local_58,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(buff_string._M_dataplus._M_p + local_58._M_current),
                         (_Iter_equals_val<const_char>)&local_100);
      buff_string._M_dataplus._M_p = _Var2._M_current + -(long)local_58._M_current;
      *_Var2._M_current = '\0';
      current_chr.field_2._8_8_ = local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(current_chr.field_2._M_local_buf + 8),local_58._M_current,
                 buff_string._M_dataplus._M_p + local_58._M_current);
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,">","");
      lVar3 = std::__cxx11::string::find(current_chr.field_2._M_local_buf + 8,(ulong)local_120[0],0)
      ;
      if (local_120[0] != local_110) {
        operator_delete(local_120[0],local_110[0] + 1);
      }
      if ((long *)current_chr.field_2._8_8_ != local_90) {
        operator_delete((void *)current_chr.field_2._8_8_,local_90[0] + 1);
      }
      if (lVar3 == 0) {
        if ((buff_string.field_2._12_4_ & 1) == 0) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)tmp_str.field_2._8_8_,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100.second._M_dataplus._M_p != &local_100.second.field_2) {
            operator_delete(local_100.second._M_dataplus._M_p,
                            local_100.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_100.first._M_dataplus._M_p._1_7_,
                          local_100.first._M_dataplus._M_p._0_1_) != &local_100.first.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_100.first._M_dataplus._M_p._1_7_,
                                     local_100.first._M_dataplus._M_p._0_1_),
                            local_100.first.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          buff_string.field_2._12_4_ = 0;
        }
        std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_58);
        std::__cxx11::string::operator=((string *)local_c0,(string *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_100.first._M_dataplus._M_p._1_7_,
                        local_100.first._M_dataplus._M_p._0_1_) != &local_100.first.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_100.first._M_dataplus._M_p._1_7_,
                                   local_100.first._M_dataplus._M_p._0_1_),
                          local_100.first.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_replace((ulong)local_80,0,tmp_str._M_dataplus._M_p,0x12f112);
      }
      else {
        std::__cxx11::string::_M_append(local_80,(ulong)local_58._M_current);
      }
      if ((size_type *)local_58._M_current != &buff_string._M_string_length) {
        operator_delete(local_58._M_current,buff_string._M_string_length + 1);
      }
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_100,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)tmp_str.field_2._8_8_,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.second._M_dataplus._M_p != &local_100.second.field_2) {
      operator_delete(local_100.second._M_dataplus._M_p,
                      local_100.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_100.first._M_dataplus._M_p._1_7_,local_100.first._M_dataplus._M_p._0_1_)
        != &local_100.first.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_100.first._M_dataplus._M_p._1_7_,
                               local_100.first._M_dataplus._M_p._0_1_),
                      local_100.first.field_2._M_allocated_capacity + 1);
    }
    std::ifstream::close();
  }
  if (local_c0 != (undefined1  [8])&current_chr._M_string_length) {
    operator_delete((void *)local_c0,current_chr._M_string_length + 1);
  }
  if (local_80 != (undefined1  [8])&tmp_str._M_string_length) {
    operator_delete((void *)local_80,tmp_str._M_string_length + 1);
  }
  std::ifstream::~ifstream(&local_328);
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)tmp_str.field_2._8_8_;
}

Assistant:

map<string,string> * get_reference_map(string reference){
    map<string,string> * ref = new map<string,string>();
    ifstream ref_handle (reference );
    string tmp_str="";
    char * buffer =  (char *)calloc(1024,sizeof(char));
    string current_chr = "";
    bool first = true;
    if (ref_handle.is_open()){
        while(1){
            ref_handle.getline(buffer,1024);
            if(!ref_handle.eof()){
                string buff_string(buffer);
                buff_string.erase(std::remove(buff_string.begin(), buff_string.end(), '\n'), buff_string.end());
                if (startsWith(buff_string,string(">"))) {
                    if (!first){
                        ref->insert ( std::pair<string,string>(current_chr,tmp_str) );
                    }else{
                        first = false;
                    }
                    current_chr =  buff_string.substr(1, buff_string.length() - 1);
                    tmp_str = "";
                }else{
                    tmp_str += buff_string;
                }
            }else{
                break;
            }
        }
        ref->insert ( std::pair<string,string>(current_chr,tmp_str) );
        ref_handle.close();

    }

    return ref;
}